

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O3

void __thiscall Fl_Window::free_icons(Fl_Window *this)

{
  long *plVar1;
  icon_data *piVar2;
  void *pvVar3;
  long lVar4;
  
  piVar2 = this->icon_;
  *(undefined8 *)piVar2 = 0;
  pvVar3 = *(void **)(piVar2 + 8);
  if (pvVar3 == (void *)0x0) goto LAB_001dd3f0;
  if (*(int *)(piVar2 + 0x10) < 1) {
LAB_001dd3dc:
    operator_delete__(pvVar3);
    piVar2 = this->icon_;
  }
  else {
    lVar4 = 0;
    do {
      plVar1 = *(long **)(*(long *)(piVar2 + 8) + lVar4 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
        piVar2 = this->icon_;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(piVar2 + 0x10));
    pvVar3 = *(void **)(piVar2 + 8);
    if (pvVar3 != (void *)0x0) goto LAB_001dd3dc;
  }
  *(undefined8 *)(piVar2 + 8) = 0;
LAB_001dd3f0:
  *(undefined4 *)(piVar2 + 0x10) = 0;
  return;
}

Assistant:

void Fl_Window::free_icons() {
  int i;

  icon_->legacy_icon = 0L;

  if (icon_->icons) {
    for (i = 0;i < icon_->count;i++)
      delete icon_->icons[i];
    delete [] icon_->icons;
    icon_->icons = 0L;
  }

  icon_->count = 0;

#ifdef WIN32
  if (icon_->big_icon)
    DestroyIcon(icon_->big_icon);
  if (icon_->small_icon)
    DestroyIcon(icon_->small_icon);

  icon_->big_icon = NULL;
  icon_->small_icon = NULL;
#endif
}